

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O3

Value * duckdb::DebugVerifyVectorSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  char *pcVar2;
  allocator local_51;
  string local_50;
  string local_30;
  
  pDVar1 = DBConfig::GetConfig(context);
  pcVar2 = EnumUtil::ToChars<duckdb::DebugVectorVerification>((pDVar1->options).debug_verify_vector)
  ;
  ::std::__cxx11::string::string((string *)&local_30,pcVar2,&local_51);
  StringUtil::Lower(&local_50,&local_30);
  Value::Value(__return_storage_ptr__,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Value DebugVerifyVectorSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	return Value(StringUtil::Lower(EnumUtil::ToString(config.options.debug_verify_vector)));
}